

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status leveldb::DB::Open(Options *options,string *dbname,DB **dbptr)

{
  long lVar1;
  bool bVar2;
  undefined1 uVar3;
  long *plVar4;
  uint64_t uVar5;
  void *pvVar6;
  undefined8 *in_RCX;
  long in_RSI;
  DBImpl *in_RDI;
  long in_FS_OFFSET;
  uint64_t new_log_number;
  DBImpl *impl;
  Status *s;
  WritableFile *lfile;
  bool save_manifest;
  VersionEdit edit;
  DBImpl *in_stack_fffffffffffffe58;
  Status *in_stack_fffffffffffffe60;
  Status *in_stack_fffffffffffffe68;
  undefined5 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe75;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  VersionEdit *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  MemTable *this;
  DBImpl *this_00;
  string *in_stack_ffffffffffffff18;
  VersionEdit *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  byte bVar7;
  undefined1 local_d0 [128];
  bool *in_stack_ffffffffffffffb0;
  VersionEdit *in_stack_ffffffffffffffb8;
  DBImpl *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RCX = 0;
  this_00 = in_RDI;
  plVar4 = (long *)operator_new(0x2e0);
  DBImpl::DBImpl((DBImpl *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                 (Options *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  port::Mutex::Lock((Mutex *)in_stack_fffffffffffffe58);
  VersionEdit::VersionEdit(in_stack_fffffffffffffe88);
  bVar7 = 0;
  DBImpl::Recover(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  bVar2 = Status::ok((Status *)in_stack_fffffffffffffe58);
  if ((bVar2) && (plVar4[0x26] == 0)) {
    uVar5 = VersionSet::NewFileNumber((VersionSet *)in_stack_fffffffffffffe58);
    this = *(MemTable **)(in_RSI + 0x10);
    LogFileName((string *)
                CONCAT17(in_stack_fffffffffffffe77,
                         CONCAT16(in_stack_fffffffffffffe76,
                                  CONCAT15(in_stack_fffffffffffffe75,in_stack_fffffffffffffe70))),
                (uint64_t)in_stack_fffffffffffffe68);
    (*(this->comparator_).comparator.super_Comparator._vptr_Comparator[4])
              (&stack0xffffffffffffff18,this,local_d0,&stack0xffffffffffffff20);
    Status::operator=(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    Status::~Status((Status *)in_stack_fffffffffffffe58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe58);
    uVar3 = Status::ok((Status *)in_stack_fffffffffffffe58);
    if ((bool)uVar3) {
      VersionEdit::SetLogNumber((VersionEdit *)in_stack_fffffffffffffe58,0xd15fc2);
      plVar4[0x29] = (long)in_stack_ffffffffffffff20;
      plVar4[0x2a] = uVar5;
      pvVar6 = operator_new(0x20);
      log::Writer::Writer((Writer *)in_stack_fffffffffffffe58,(WritableFile *)0xd16012);
      plVar4[0x2b] = (long)pvVar6;
      pvVar6 = operator_new(0x70);
      MemTable::MemTable(this,(InternalKeyComparator *)CONCAT17(uVar3,in_stack_fffffffffffffe90));
      plVar4[0x26] = (long)pvVar6;
      MemTable::Ref((MemTable *)in_stack_fffffffffffffe58);
    }
  }
  bVar2 = Status::ok((Status *)in_stack_fffffffffffffe58);
  if ((bVar2) && ((bVar7 & 1) != 0)) {
    VersionEdit::SetPrevLogNumber((VersionEdit *)in_stack_fffffffffffffe58,0xd161a2);
    VersionEdit::SetLogNumber((VersionEdit *)in_stack_fffffffffffffe58,0xd161c0);
    VersionSet::LogAndApply
              ((VersionSet *)CONCAT17(bVar7,in_stack_ffffffffffffff28),in_stack_ffffffffffffff20,
               (Mutex *)in_stack_ffffffffffffff18);
    Status::operator=(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    Status::~Status((Status *)in_stack_fffffffffffffe58);
  }
  bVar2 = Status::ok((Status *)in_stack_fffffffffffffe58);
  if (bVar2) {
    DBImpl::DeleteObsoleteFiles(this_00);
    DBImpl::MaybeScheduleCompaction(in_stack_fffffffffffffe58);
  }
  port::Mutex::Unlock((Mutex *)in_stack_fffffffffffffe58);
  bVar2 = Status::ok((Status *)in_stack_fffffffffffffe58);
  if (bVar2) {
    if (plVar4[0x26] == 0) {
      __assert_fail("impl->mem_ != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                    ,0x5ea,
                    "static Status leveldb::DB::Open(const Options &, const std::string &, DB **)");
    }
    *in_RCX = plVar4;
  }
  else if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 8))();
  }
  VersionEdit::~VersionEdit((VersionEdit *)in_stack_fffffffffffffe58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)(char *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status DB::Open(const Options& options, const std::string& dbname, DB** dbptr) {
  *dbptr = nullptr;

  DBImpl* impl = new DBImpl(options, dbname);
  impl->mutex_.Lock();
  VersionEdit edit;
  // Recover handles create_if_missing, error_if_exists
  bool save_manifest = false;
  Status s = impl->Recover(&edit, &save_manifest);
  if (s.ok() && impl->mem_ == nullptr) {
    // Create new log and a corresponding memtable.
    uint64_t new_log_number = impl->versions_->NewFileNumber();
    WritableFile* lfile;
    s = options.env->NewWritableFile(LogFileName(dbname, new_log_number),
                                     &lfile);
    if (s.ok()) {
      edit.SetLogNumber(new_log_number);
      impl->logfile_ = lfile;
      impl->logfile_number_ = new_log_number;
      impl->log_ = new log::Writer(lfile);
      impl->mem_ = new MemTable(impl->internal_comparator_);
      impl->mem_->Ref();
    }
  }
  if (s.ok() && save_manifest) {
    edit.SetPrevLogNumber(0);  // No older logs needed after recovery.
    edit.SetLogNumber(impl->logfile_number_);
    s = impl->versions_->LogAndApply(&edit, &impl->mutex_);
  }
  if (s.ok()) {
    impl->DeleteObsoleteFiles();
    impl->MaybeScheduleCompaction();
  }
  impl->mutex_.Unlock();
  if (s.ok()) {
    assert(impl->mem_ != nullptr);
    *dbptr = impl;
  } else {
    delete impl;
  }
  return s;
}